

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_radio_text(nk_context *ctx,char *text,int len,nk_bool *active)

{
  int iVar1;
  nk_bool nVar2;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int old_value;
  nk_bool in_stack_00000018;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RCX == (int *)0x0)) {
    local_4 = 0;
  }
  else {
    iVar1 = *in_RCX;
    nVar2 = nk_option_text(ctx,text,len,in_stack_00000018);
    *in_RCX = nVar2;
    local_4 = (uint)(iVar1 != *in_RCX);
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_radio_text(struct nk_context *ctx, const char *text, int len, nk_bool *active)
{
int old_value;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(active);
if (!ctx || !text || !active) return 0;
old_value = *active;
*active = nk_option_text(ctx, text, len, old_value);
return old_value != *active;
}